

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_mathWithNamespacesDefinedOnTheMathNode_Test::TestBody
          (Parser_mathWithNamespacesDefinedOnTheMathNode_Test *this)

{
  char *pcVar1;
  unsigned_long local_70;
  unsigned_long local_68;
  AssertionResult gtest_ar;
  ParserPtr parser;
  string local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n  <component name=\"\">\n  <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <apply>\n      <eq/>\n      <ci>b2</ci>\n      <apply>\n        <times/>\n        <cn cellml:units=\"dimensionless\">2.0</cn>\n        <ci>d</ci>\n      </apply>\n    </apply>\n  </math>\n  </component>\n</model>\n"
             ,(allocator<char> *)&parser);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel(local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  local_70 = 0;
  local_68 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",&local_70,&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x892,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, mathWithNamespacesDefinedOnTheMathNode)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"\">\n"
        "  <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <apply>\n"
        "      <eq/>\n"
        "      <ci>b2</ci>\n"
        "      <apply>\n"
        "        <times/>\n"
        "        <cn cellml:units=\"dimensionless\">2.0</cn>\n"
        "        <ci>d</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "  </math>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());
}